

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionVersion_Test::TestBody
          (SSLVersionTest_SessionVersion_Test *this)

{
  bool bVar1;
  uint16_t version;
  int iVar2;
  pointer psVar3;
  pointer server_ctx;
  char *pcVar4;
  pointer psVar5;
  SSL_SESSION *__p;
  UniquePtr<SSL_CTX> *this_00;
  UniquePtr<SSL_CTX> *this_01;
  char *in_R9;
  AssertHelper local_1d0;
  Message local_1c8;
  uint16_t local_1bc;
  uint16_t local_1ba;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_188;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  Message local_118;
  bool local_10a;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  uint16_t local_e4;
  uint16_t local_e2;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  ClientConfig local_78;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_18;
  UniquePtr<SSL_SESSION> session;
  SSLVersionTest_SessionVersion_Test *this_local;
  
  this_00 = &(this->super_SSLVersionTest).client_ctx_;
  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_00);
  SSL_CTX_set_session_cache_mode(psVar3,3);
  this_01 = &(this->super_SSLVersionTest).server_ctx_;
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_01);
  SSL_CTX_set_session_cache_mode(psVar3,3);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_00);
  server_ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(this_01);
  local_78.verify_hostname.field_2._M_allocated_capacity = 0;
  local_78.verify_hostname.field_2._8_8_ = 0;
  local_78.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
  local_78.verify_hostname._1_7_ = 0;
  local_78.verify_hostname._M_string_length = 0;
  local_78.servername.field_2._M_allocated_capacity = 0;
  local_78.servername.field_2._8_8_ = 0;
  local_78.servername._M_dataplus = (_Alloc_hider)0x0;
  local_78.servername._1_7_ = 0;
  local_78.servername._M_string_length = 0;
  local_78.session = (SSL_SESSION *)0x0;
  local_78.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
  local_78.hostflags = 0;
  local_78.early_data = false;
  local_78._85_3_ = 0;
  ClientConfig::ClientConfig(&local_78);
  CreateClientSession((anon_unknown_0 *)&local_18,psVar3,server_ctx,&local_78);
  ClientConfig::~ClientConfig(&local_78);
  testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_98,&local_18,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_98,(AssertionResult *)0x4f1864,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x16fd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_e2 = SSLVersionTest::version(&this->super_SSLVersionTest);
    psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_18);
    local_e4 = SSL_SESSION_get_protocol_version(psVar5);
    testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
              ((EqHelper *)local_e0,"version()","SSL_SESSION_get_protocol_version(session.get())",
               &local_e2,&local_e4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x16fe,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    local_109 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
    psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_18);
    iVar2 = SSL_SESSION_should_be_single_use(psVar5);
    local_10a = iVar2 != 0;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              ((EqHelper *)local_108,"is_tls13()",
               "!!SSL_SESSION_should_be_single_use(session.get())",&local_109,&local_10a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1701,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
              (&(this->super_SSLVersionTest).client_ctx_);
    __p = SSL_SESSION_new();
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::reset(&local_18,(pointer)__p);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_130,&local_18,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_130,(AssertionResult *)0x4f1864,
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1705,pcVar4);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_138);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_18);
      version = SSLVersionTest::version(&this->super_SSLVersionTest);
      local_174 = SSL_SESSION_set_protocol_version(psVar5,version);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_170,&local_174,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_180);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_170,
                   (AssertionResult *)"SSL_SESSION_set_protocol_version(session.get(), version())",
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_188,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1706,pcVar4);
        testing::internal::AssertHelper::operator=(&local_188,&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_188);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_180);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_1ba = SSLVersionTest::version(&this->super_SSLVersionTest);
        psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_18);
        local_1bc = SSL_SESSION_get_protocol_version(psVar5);
        testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
                  ((EqHelper *)local_1b8,"version()",
                   "SSL_SESSION_get_protocol_version(session.get())",&local_1ba,&local_1bc);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1707,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionVersion) {
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);
  EXPECT_EQ(version(), SSL_SESSION_get_protocol_version(session.get()));

  // Sessions in TLS 1.3 and later should be single-use.
  EXPECT_EQ(is_tls13(), !!SSL_SESSION_should_be_single_use(session.get()));

  // Making fake sessions for testing works.
  session.reset(SSL_SESSION_new(client_ctx_.get()));
  ASSERT_TRUE(session);
  ASSERT_TRUE(SSL_SESSION_set_protocol_version(session.get(), version()));
  EXPECT_EQ(version(), SSL_SESSION_get_protocol_version(session.get()));
}